

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_ori_i32_mipsel(TCGContext_conflict4 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  uintptr_t o_5;
  TCGOp *pTVar1;
  TCGv_i32 pTVar2;
  uintptr_t o;
  uintptr_t o_2;
  
  if (arg2 == 0) {
    if (ret != arg1) {
      pTVar1 = tcg_emit_op_mipsel(tcg_ctx,INDEX_op_mov_i32);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    }
  }
  else {
    if (arg2 != -1) {
      pTVar2 = tcg_const_i32_mipsel(tcg_ctx,arg2);
      pTVar1 = tcg_emit_op_mipsel(tcg_ctx,INDEX_op_or_i32);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
      pTVar1->args[2] = (TCGArg)(pTVar2 + (long)tcg_ctx);
      tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      return;
    }
    pTVar1 = tcg_emit_op_mipsel(tcg_ctx,INDEX_op_movi_i32);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void tcg_gen_ori_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    /* Some cases can be optimized here.  */
    if (arg2 == -1) {
        tcg_gen_movi_i32(tcg_ctx, ret, -1);
    } else if (arg2 == 0) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_or_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}